

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

void __thiscall helics::BrokerBase::setErrorState(BrokerBase *this,int eCode,string_view estring)

{
  BrokerState BVar1;
  rep rVar2;
  string_view name;
  ActionMessage halt;
  ActionMessage local_e0;
  
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->lastErrorString,0,(this->lastErrorString)._M_string_length,estring._M_str,
             estring._M_len);
  LOCK();
  (this->lastErrorCode).super___atomic_base<int>._M_i = eCode;
  UNLOCK();
  BVar1 = (this->brokerState)._M_i;
  if ((BrokerState)(BVar1 & ~TERMINATING) != CONNECTED_ERROR) {
    LOCK();
    (this->brokerState)._M_i =
         (ushort)(8 < (ushort)(BVar1 + TERMINATING_ERROR)) * 4 + CONNECTED_ERROR;
    UNLOCK();
    if ((((this->errorDelay).internalTimeCode < 1) || (eCode == 0x8f)) || (eCode == 0x82)) {
      ActionMessage::ActionMessage
                (&local_e0,cmd_user_disconnect,(GlobalFederateId)(this->global_id)._M_i.gid,
                 (GlobalFederateId)(this->global_id)._M_i.gid);
      addActionMessage(this,&local_e0);
    }
    else {
      rVar2 = std::chrono::_V2::steady_clock::now();
      (this->errorTimeStart).__d.__r = rVar2;
      ActionMessage::ActionMessage
                (&local_e0,cmd_error_check,(GlobalFederateId)(this->global_id)._M_i.gid,
                 (GlobalFederateId)(this->global_id)._M_i.gid);
      addActionMessage(this,&local_e0);
    }
    ActionMessage::~ActionMessage(&local_e0);
  }
  name._M_str = (this->identifier)._M_dataplus._M_p;
  name._M_len = (this->identifier)._M_string_length;
  sendToLogger(this,(GlobalFederateId)(this->global_id)._M_i.gid,0,name,estring,false);
  return;
}

Assistant:

void BrokerBase::setErrorState(int eCode, std::string_view estring)
{
    lastErrorString.assign(estring.data(), estring.size());
    lastErrorCode.store(eCode);
    auto cBrokerState = brokerState.load();
    if (cBrokerState != BrokerState::ERRORED && cBrokerState != BrokerState::CONNECTED_ERROR) {
        if (cBrokerState > BrokerState::CONFIGURED && cBrokerState < BrokerState::TERMINATING) {
            brokerState.store(BrokerState::CONNECTED_ERROR);
        } else {
            brokerState.store(BrokerState::ERRORED);
        }
        if (errorDelay <= timeZero || eCode == HELICS_ERROR_TERMINATED ||
            eCode == HELICS_ERROR_USER_ABORT) {
            const ActionMessage halt(CMD_USER_DISCONNECT, global_id.load(), global_id.load());
            addActionMessage(halt);
        } else {
            errorTimeStart = std::chrono::steady_clock::now();
            const ActionMessage echeck(CMD_ERROR_CHECK, global_id.load(), global_id.load());
            addActionMessage(echeck);
        }
    }

    sendToLogger(global_id.load(), HELICS_LOG_LEVEL_ERROR, identifier, estring);
}